

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O0

void __thiscall
icu_63::LaoBreakEngine::LaoBreakEngine
          (LaoBreakEngine *this,DictionaryMatcher *adoptDictionary,UErrorCode *status)

{
  UBool UVar1;
  ConstChar16Ptr local_c0;
  UnicodeString local_b8;
  ConstChar16Ptr local_78;
  UnicodeString local_70;
  UErrorCode *local_20;
  UErrorCode *status_local;
  DictionaryMatcher *adoptDictionary_local;
  LaoBreakEngine *this_local;
  
  local_20 = status;
  status_local = (UErrorCode *)adoptDictionary;
  adoptDictionary_local = (DictionaryMatcher *)this;
  DictionaryBreakEngine::DictionaryBreakEngine(&this->super_DictionaryBreakEngine);
  (this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine =
       (_func_int **)&PTR__LaoBreakEngine_004b8bd0;
  UnicodeSet::UnicodeSet(&this->fLaoWordSet);
  UnicodeSet::UnicodeSet(&this->fEndWordSet);
  UnicodeSet::UnicodeSet(&this->fBeginWordSet);
  UnicodeSet::UnicodeSet(&this->fMarkSet);
  this->fDictionary = (DictionaryMatcher *)status_local;
  ConstChar16Ptr::ConstChar16Ptr(&local_78,L"[[:Laoo:]&[:LineBreak=SA:]]");
  UnicodeString::UnicodeString(&local_70,'\x01',&local_78,-1);
  UnicodeSet::applyPattern(&this->fLaoWordSet,&local_70,local_20);
  UnicodeString::~UnicodeString(&local_70);
  ConstChar16Ptr::~ConstChar16Ptr(&local_78);
  UVar1 = ::U_SUCCESS(*local_20);
  if (UVar1 != '\0') {
    (*(this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine[4])
              (this,&this->fLaoWordSet);
  }
  ConstChar16Ptr::ConstChar16Ptr(&local_c0,L"[[:Laoo:]&[:LineBreak=SA:]&[:M:]]");
  UnicodeString::UnicodeString(&local_b8,'\x01',&local_c0,-1);
  UnicodeSet::applyPattern(&this->fMarkSet,&local_b8,local_20);
  UnicodeString::~UnicodeString(&local_b8);
  ConstChar16Ptr::~ConstChar16Ptr(&local_c0);
  UnicodeSet::add(&this->fMarkSet,0x20);
  UnicodeSet::operator=(&this->fEndWordSet,&this->fLaoWordSet);
  UnicodeSet::remove(&this->fEndWordSet,(char *)0xec0);
  UnicodeSet::add(&this->fBeginWordSet,0xe81,0xeae);
  UnicodeSet::add(&this->fBeginWordSet,0xedc,0xedd);
  UnicodeSet::add(&this->fBeginWordSet,0xec0,0xec4);
  UnicodeSet::compact(&this->fMarkSet);
  UnicodeSet::compact(&this->fEndWordSet);
  UnicodeSet::compact(&this->fBeginWordSet);
  return;
}

Assistant:

LaoBreakEngine::LaoBreakEngine(DictionaryMatcher *adoptDictionary, UErrorCode &status)
    : DictionaryBreakEngine(),
      fDictionary(adoptDictionary)
{
    fLaoWordSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Laoo:]&[:LineBreak=SA:]]"), status);
    if (U_SUCCESS(status)) {
        setCharacters(fLaoWordSet);
    }
    fMarkSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Laoo:]&[:LineBreak=SA:]&[:M:]]"), status);
    fMarkSet.add(0x0020);
    fEndWordSet = fLaoWordSet;
    fEndWordSet.remove(0x0EC0, 0x0EC4);     // prefix vowels
    fBeginWordSet.add(0x0E81, 0x0EAE);      // basic consonants (including holes for corresponding Thai characters)
    fBeginWordSet.add(0x0EDC, 0x0EDD);      // digraph consonants (no Thai equivalent)
    fBeginWordSet.add(0x0EC0, 0x0EC4);      // prefix vowels

    // Compact for caching.
    fMarkSet.compact();
    fEndWordSet.compact();
    fBeginWordSet.compact();
}